

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveFinder.cpp
# Opt level: O2

void __thiscall
senjo::MoveFinder::AddKnightMoves
          (MoveFinder *this,
          set<senjo::Square,_std::less<senjo::Square>,_std::allocator<senjo::Square>_> *origins,
          int x,int y,char cap,list<senjo::ChessMove,_std::allocator<senjo::ChessMove>_> *moves)

{
  Direction DVar1;
  _Base_ptr p_Var2;
  _Rb_tree_color _Var3;
  _Rb_tree_color _Var4;
  Square local_60;
  int local_5c;
  int local_58;
  ChessMove local_54;
  MoveFinder *local_48;
  list<senjo::ChessMove,_std::allocator<senjo::ChessMove>_> *local_40;
  Square local_34;
  
  local_54.cap = '\0';
  local_54.promo = '\0';
  _Var3 = 0x78;
  p_Var2 = (origins->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  _Var4 = y * 0x10 + x;
  if (7 < (uint)(y | x)) {
    _Var4 = _Var3;
  }
  local_5c = (int)cap;
  local_58 = y;
  local_54.to.sqr = _Var3;
  local_48 = this;
  local_40 = moves;
  do {
    if ((_Rb_tree_header *)p_Var2 == &(origins->_M_t)._M_impl.super__Rb_tree_header) {
      return;
    }
    local_54.from.sqr = p_Var2[1]._M_color;
    local_34.sqr = _Var4;
    DVar1 = Square::DirectionTo(&local_54.from,&local_34);
    if (DVar1 == KnightMove1) {
LAB_00133348:
      local_60.sqr = local_54.from.sqr - 0x21;
      if (((local_54.from.sqr | local_54.from.sqr - 0x21) & 0xffffff88) != _S_red) {
        local_60.sqr = _Var3;
      }
      if ((local_60.sqr & 0xffffff88) == _S_red) {
        AddMove(local_48,&local_54,&local_60,x,local_58,(char)local_5c,local_40);
      }
      if (DVar1 == Unknown) {
LAB_001333ae:
        local_60.sqr = local_54.from.sqr - 0x1f;
        if (((local_54.from.sqr | local_60.sqr) & 0xffffff88) != _S_red) {
          local_60.sqr = 0x78;
        }
        if ((local_60.sqr & 0xffffff88) == _S_red) {
          AddMove(local_48,&local_54,&local_60,x,local_58,(char)local_5c,local_40);
        }
        if (DVar1 == Unknown) {
LAB_0013340a:
          local_60.sqr = local_54.from.sqr - 0x12;
          if (((local_54.from.sqr | local_60.sqr) & 0xffffff88) != _S_red) {
            local_60.sqr = 0x78;
          }
          if ((local_60.sqr & 0xffffff88) == _S_red) {
            AddMove(local_48,&local_54,&local_60,x,local_58,(char)local_5c,local_40);
          }
          if ((DVar1 != Unknown) && (DVar1 != KnightMove4)) goto LAB_001335e3;
        }
        else if (DVar1 != KnightMove4) {
          if (DVar1 != KnightMove3) goto LAB_001335e3;
          goto LAB_0013340a;
        }
LAB_00133460:
        local_60.sqr = local_54.from.sqr - 0xe;
        if (((local_54.from.sqr | local_60.sqr) & 0xffffff88) != _S_red) {
          local_60.sqr = 0x78;
        }
        if ((local_60.sqr & 0xffffff88) == _S_red) {
          AddMove(local_48,&local_54,&local_60,x,local_58,(char)local_5c,local_40);
        }
        if (DVar1 == Unknown) {
LAB_001334b0:
          local_60.sqr = local_54.from.sqr + 0xe;
          if (((local_54.from.sqr | local_60.sqr) & 0xffffff88) != _S_red) {
            local_60.sqr = 0x78;
          }
          if ((local_60.sqr & 0xffffff88) == _S_red) {
            AddMove(local_48,&local_54,&local_60,x,local_58,(char)local_5c,local_40);
          }
          if (DVar1 == Unknown) {
LAB_00133500:
            local_60.sqr = local_54.from.sqr + 0x12;
            if (((local_54.from.sqr | local_60.sqr) & 0xffffff88) != _S_red) {
              local_60.sqr = 0x78;
            }
            if ((local_60.sqr & 0xffffff88) == _S_red) {
              AddMove(local_48,&local_54,&local_60,x,local_58,(char)local_5c,local_40);
            }
            if (DVar1 == Unknown) {
LAB_00133550:
              local_60.sqr = local_54.from.sqr + 0x1f;
              if (((local_54.from.sqr | local_60.sqr) & 0xffffff88) != _S_red) {
                local_60.sqr = 0x78;
              }
              if ((local_60.sqr & 0xffffff88) == _S_red) {
                AddMove(local_48,&local_54,&local_60,x,local_58,(char)local_5c,local_40);
              }
              if (DVar1 == Unknown) goto LAB_0013359c;
            }
          }
        }
      }
      else {
        if (DVar1 == KnightMove3) goto LAB_0013340a;
        if (DVar1 == KnightMove4) goto LAB_00133460;
        if (DVar1 == KnightMove2) goto LAB_001333ae;
      }
    }
    else {
      if (DVar1 == KnightMove2) goto LAB_001333ae;
      if (DVar1 == KnightMove3) goto LAB_0013340a;
      if (DVar1 == KnightMove4) goto LAB_00133460;
      if (DVar1 != KnightMove8) {
        if (DVar1 == KnightMove5) goto LAB_001334b0;
        if (DVar1 == KnightMove6) goto LAB_00133500;
        if (DVar1 != KnightMove7) {
          if (DVar1 == Unknown) goto LAB_00133348;
          goto LAB_001335e3;
        }
        goto LAB_00133550;
      }
LAB_0013359c:
      local_60.sqr = local_54.from.sqr + 0x21;
      if (((local_54.from.sqr | local_60.sqr) & 0xffffff88) != _S_red) {
        local_60.sqr = 0x78;
      }
      if ((local_60.sqr & 0xffffff88) == _S_red) {
        AddMove(local_48,&local_54,&local_60,x,local_58,(char)local_5c,local_40);
      }
    }
LAB_001335e3:
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

void MoveFinder::AddKnightMoves(const std::set<Square>& origins,
                                const int x, const int y, const char cap,
                                std::list<ChessMove>& moves) const
{
  ChessMove move;
  Direction direction;
  Square    dest;
  std::set<Square>::const_iterator it;
  for (it = origins.begin(); it != origins.end(); ++it) {
    move.from = *it;
    direction = move.from.DirectionTo(Square(x, y));
    if ((direction == Direction::Unknown) || (direction == KnightMove1)) {
      if ((dest = (move.from + KnightMove1)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove2)) {
      if ((dest = (move.from + KnightMove2)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove3)) {
      if ((dest = (move.from + KnightMove3)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove4)) {
      if ((dest = (move.from + KnightMove4)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove5)) {
      if ((dest = (move.from + KnightMove5)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove6)) {
      if ((dest = (move.from + KnightMove6)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove7)) {
      if ((dest = (move.from + KnightMove7)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove8)) {
      if ((dest = (move.from + KnightMove8)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
  }
}